

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

int disas_coproc_insn(DisasContext_conflict1 *s,uint32_t insn)

{
  int iVar1;
  TCGContext_conflict1 *pTVar2;
  TCGContext_conflict1 *pTVar3;
  CPReadFn_conflict *pCVar4;
  CPWriteFn_conflict *pCVar5;
  byte bVar6;
  int iVar7;
  uintptr_t o_10;
  TCGTemp *pTVar8;
  TCGv_i32 pTVar9;
  TCGv_i32 pTVar10;
  ARMCPRegInfo_conflict *val;
  TCGv_i64 pTVar11;
  TCGv_i32 high;
  TCGv_i64 pTVar12;
  uintptr_t o;
  uint uVar13;
  uint uVar14;
  code *pcVar15;
  uint val_00;
  uint uVar16;
  uint uVar17;
  uintptr_t o_1;
  uint uVar18;
  TCGContext_conflict1 *tcg_ctx;
  uint reg;
  uint uVar19;
  uintptr_t o_9;
  TCGTemp *args [1];
  uint local_80;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  pTVar2 = s->uc->tcg_ctx;
  uVar17 = insn >> 8 & 0xf;
  if (uVar17 < 2 && (s->features & 2) != 0) {
    if (((uint)s->c15_cpar >> uVar17 & 1) == 0) {
      return 1;
    }
    if ((s->features & 4) != 0) {
      iVar7 = disas_iwmmxt_insn(s,insn);
      return iVar7;
    }
    if ((insn & 0xff00f10) == 0xe200010) {
      if ((insn & 0xe0) != 0) {
        return 1;
      }
      pTVar8 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
      pTVar9 = (TCGv_i32)((long)pTVar8 - (long)pTVar2);
      load_reg_var(s,pTVar9,insn >> 0xc & 0xf);
      pTVar3 = s->uc->tcg_ctx;
      pTVar8 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
      pTVar10 = (TCGv_i32)((long)pTVar8 - (long)pTVar3);
      load_reg_var(s,pTVar10,insn & 0xf);
      uVar17 = insn >> 0x10 & 0xf;
      if (uVar17 - 0xc < 4) {
        if ((insn >> 0x10 & 1) != 0) {
          tcg_gen_shri_i32_aarch64(pTVar2,pTVar9,pTVar9,0x10);
        }
        if ((insn >> 0x11 & 1) != 0) {
          tcg_gen_shri_i32_aarch64(pTVar2,pTVar10,pTVar10,0x10);
        }
        local_58 = (TCGTemp *)(pTVar2->cpu_M0 + (long)pTVar2);
        pcVar15 = helper_iwmmxt_muladdswl_aarch64;
      }
      else if (uVar17 == 8) {
        local_58 = (TCGTemp *)(pTVar2->cpu_M0 + (long)pTVar2);
        pcVar15 = helper_iwmmxt_muladdsw_aarch64;
      }
      else {
        if (uVar17 != 0) {
          return 1;
        }
        local_58 = (TCGTemp *)(pTVar2->cpu_M0 + (long)pTVar2);
        pcVar15 = helper_iwmmxt_muladdsl_aarch64;
      }
      local_48 = (TCGTemp *)(pTVar10 + (long)pTVar2);
      local_50 = (TCGTemp *)(pTVar9 + (long)pTVar2);
      tcg_gen_callN_aarch64(pTVar2,pcVar15,local_58,3,&local_58);
      tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar10 + (long)pTVar2));
      tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar9 + (long)pTVar2));
      pTVar11 = pTVar2->cpu_M0;
    }
    else {
      if ((insn & 0xfe00ff8) != 0xc400000) {
        return 1;
      }
      if ((insn & 7) != 0) {
        return 1;
      }
      uVar17 = insn >> 0x10 & 0xf;
      uVar14 = insn >> 0xc & 0xf;
      if ((insn >> 0x14 & 1) != 0) {
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i64,(TCGArg)(pTVar2->cpu_V0 + (long)pTVar2),
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),0x2f18);
        tcg_gen_extrl_i64_i32_aarch64(pTVar2,pTVar2->cpu_R[uVar14],pTVar2->cpu_V0);
        tcg_gen_extrh_i64_i32_aarch64(pTVar2,pTVar2->cpu_R[uVar17],pTVar2->cpu_V0);
        tcg_gen_andi_i32_aarch64(pTVar2,pTVar2->cpu_R[uVar17],pTVar2->cpu_R[uVar17],0xff);
        return 0;
      }
      tcg_gen_concat_i32_i64_aarch64
                (pTVar2,pTVar2->cpu_V0,pTVar2->cpu_R[uVar14],pTVar2->cpu_R[uVar17]);
      pTVar11 = pTVar2->cpu_V0;
    }
    tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i64,(TCGArg)(pTVar11 + (long)pTVar2),
                        (TCGArg)(pTVar2->cpu_env + (long)pTVar2),0x2f18);
    return 0;
  }
  if ((insn & 0x2000010) == 0x2000000) {
    return 1;
  }
  uVar14 = insn & 0x2000000;
  uVar16 = insn & 0xf;
  if (uVar14 == 0) {
    uVar19 = insn >> 4 & 0xf;
    local_80 = insn >> 0x10 & 0xf;
    uVar13 = 0;
    uVar18 = 0;
  }
  else {
    uVar18 = insn >> 0x10 & 0xf;
    uVar19 = insn >> 0x15 & 7;
    uVar13 = insn >> 5 & 7;
    local_80 = 0;
  }
  val = get_arm_cp_reginfo_aarch64
                  (s->cp_regs,
                   ((uVar16 << 7 | uVar18 << 0xb |
                    uVar17 << 0x10 | (uint)s->ns << 0x1d | uVar14 >> 10) + uVar19 * 8 | uVar13) ^
                   0x8000);
  if ((val == (ARMCPRegInfo_conflict *)0x0) ||
     (val_00 = insn >> 0x14 & 1, ((uint)val->access >> (val_00 + s->current_el * 2 & 0x1f) & 1) == 0
     )) {
    return 1;
  }
  reg = insn >> 0xc & 0xf;
  if (((s->hstr_active == false) && (val->accessfn == (CPAccessFn_conflict *)0x0)) &&
     ((0xd < uVar17 || ((s->features & 2) == 0)))) {
    if ((val->type & 0x8000) != 0) {
      gen_set_condexec(s);
      pTVar3 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_R[0xf] + (long)pTVar3),
                          (long)(int)s->pc_curr);
    }
  }
  else {
    if (uVar17 == 0xf) {
      if (uVar14 == 0) {
        uVar17 = val_00 + (uVar19 * 0x10000 + uVar16 * 2 | reg << 5 | local_80 << 10) + 0x13e00000;
      }
      else {
        uVar17 = (uVar18 << 10 | uVar19 << 0xe | uVar13 << 0x11) + uVar16 * 2 | reg << 5 | val_00 |
                 0xfe00000;
      }
    }
    else if (uVar17 == 0xe) {
      if (uVar14 == 0) {
        uVar17 = val_00 + (uVar19 * 0x10000 + uVar16 * 2 | reg << 5 | local_80 << 10) + 0x33e00000;
      }
      else {
        uVar17 = (uVar18 << 10 | uVar19 << 0xe | uVar13 << 0x11) + uVar16 * 2 | reg << 5 | val_00 |
                 0x17e00000;
      }
    }
    else {
      uVar17 = 0x2000000;
      if ((s->features & 0x8000000) != 0) {
        __assert_fail("!arm_dc_feature(s, ARM_FEATURE_V8)",
                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate.c"
                      ,0x1c3d,"int disas_coproc_insn(DisasContext *, uint32_t)");
      }
    }
    iVar7 = s->condexec_mask;
    if (iVar7 != 0) {
      pTVar3 = s->uc->tcg_ctx;
      iVar1 = s->condexec_cond;
      pTVar8 = tcg_temp_new_internal_aarch64(pTVar3,TCG_TYPE_I32,false);
      tcg_gen_op2_aarch64(pTVar3,INDEX_op_movi_i32,(TCGArg)pTVar8,(long)(iVar7 >> 1 | iVar1 << 4));
      tcg_gen_op3_aarch64(pTVar3,INDEX_op_st_i32,(TCGArg)pTVar8,
                          (TCGArg)(pTVar3->cpu_env + (long)pTVar3),0x224);
      tcg_temp_free_internal_aarch64(pTVar3,pTVar8);
    }
    pTVar3 = s->uc->tcg_ctx;
    tcg_gen_op2_aarch64(pTVar3,INDEX_op_movi_i32,(TCGArg)(pTVar3->cpu_R[0xf] + (long)pTVar3),
                        (long)(int)s->pc_curr);
    pTVar11 = tcg_const_i64_aarch64(pTVar2,(int64_t)val);
    pTVar9 = tcg_const_i32_aarch64(pTVar2,uVar17);
    pTVar10 = tcg_const_i32_aarch64(pTVar2,val_00);
    local_58 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
    local_50 = (TCGTemp *)(pTVar11 + (long)pTVar2);
    local_48 = (TCGTemp *)(pTVar9 + (long)pTVar2);
    local_40 = (TCGTemp *)(pTVar10 + (long)pTVar2);
    tcg_gen_callN_aarch64(pTVar2,helper_access_check_cp_reg_aarch64,(TCGTemp *)0x0,4,&local_58);
    tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
    tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar9 + (long)pTVar2));
    tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar10 + (long)pTVar2));
  }
  uVar17 = val->type;
  if ((uVar17 & 0xfffe0f01) == 0x101) {
    return 0;
  }
  if ((uVar17 & 0xfffe0f01) == 0x201) {
    if (val_00 == 0) {
      pTVar2 = s->uc->tcg_ctx;
      tcg_gen_op2_aarch64(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_R[0xf] + (long)pTVar2),
                          (long)(int)(s->base).pc_next);
      (s->base).is_jmp = DISAS_TARGET_2;
      return 0;
    }
    return 1;
  }
  if (val_00 == 0) {
    if ((uVar17 & 2) != 0) {
      return 0;
    }
    if (uVar14 == 0) {
      pTVar8 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I64,false);
      pTVar9 = (TCGv_i32)((long)pTVar8 - (long)pTVar2);
      pTVar10 = load_reg(s,reg);
      high = load_reg(s,local_80);
      tcg_gen_concat_i32_i64_aarch64(pTVar2,(TCGv_i64)pTVar9,pTVar10,high);
      tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar10 + (long)pTVar2));
      tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(high + (long)pTVar2));
      if (val->writefn == (CPWriteFn_conflict *)0x0) {
        tcg_gen_op3_aarch64(pTVar2,INDEX_op_st_i64,(TCGArg)pTVar8,
                            (TCGArg)(pTVar2->cpu_env + (long)pTVar2),val->fieldoffset);
      }
      else {
        pTVar11 = tcg_const_i64_aarch64(pTVar2,(int64_t)val);
        local_58 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
        local_48 = (TCGTemp *)((long)pTVar2 + (long)pTVar9);
        local_50 = (TCGTemp *)(pTVar11 + (long)pTVar2);
        tcg_gen_callN_aarch64(pTVar2,helper_set_cp_reg64_aarch64,(TCGTemp *)0x0,3,&local_58);
        tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
      }
LAB_00652bf7:
      pTVar8 = (TCGTemp *)((TCGv_i64)pTVar9 + (long)pTVar2);
    }
    else {
      pCVar5 = val->writefn;
      pTVar9 = load_reg(s,reg);
      if (pCVar5 == (CPWriteFn_conflict *)0x0) {
        store_cpu_offset(pTVar2,pTVar9,(int)val->fieldoffset);
        goto LAB_00652c1d;
      }
      pTVar11 = tcg_const_i64_aarch64(pTVar2,(int64_t)val);
      local_58 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
      pTVar8 = (TCGTemp *)(pTVar9 + (long)pTVar2);
      local_50 = (TCGTemp *)(pTVar11 + (long)pTVar2);
      local_48 = pTVar8;
      tcg_gen_callN_aarch64(pTVar2,helper_set_cp_reg_aarch64,(TCGTemp *)0x0,3,&local_58);
      tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
    }
    tcg_temp_free_internal_aarch64(pTVar2,pTVar8);
  }
  else {
    if (uVar14 == 0) {
      if ((uVar17 & 2) == 0) {
        pCVar4 = val->readfn;
        pTVar8 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I64,false);
        pTVar11 = (TCGv_i64)((long)pTVar8 - (long)pTVar2);
        if (pCVar4 == (CPReadFn_conflict *)0x0) {
          tcg_gen_op3_aarch64(pTVar2,INDEX_op_ld_i64,(TCGArg)pTVar8,
                              (TCGArg)(pTVar2->cpu_env + (long)pTVar2),val->fieldoffset);
        }
        else {
          pTVar12 = tcg_const_i64_aarch64(pTVar2,(int64_t)val);
          local_58 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
          local_50 = (TCGTemp *)(pTVar12 + (long)pTVar2);
          tcg_gen_callN_aarch64
                    (pTVar2,helper_get_cp_reg64_aarch64,(TCGTemp *)(pTVar11 + (long)pTVar2),2,
                     &local_58);
          tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar12 + (long)pTVar2));
        }
      }
      else {
        pTVar11 = tcg_const_i64_aarch64(pTVar2,val->resetvalue);
      }
      pTVar8 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
      tcg_gen_extrl_i64_i32_aarch64(pTVar2,(TCGv_i32)((long)pTVar8 - (long)pTVar2),pTVar11);
      store_reg(s,reg,(TCGv_i32)((long)pTVar8 - (long)pTVar2));
      pTVar8 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
      pTVar9 = (TCGv_i32)((long)pTVar8 - (long)pTVar2);
      tcg_gen_extrh_i64_i32_aarch64(pTVar2,pTVar9,pTVar11);
      tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
      reg = local_80;
    }
    else {
      if ((uVar17 & 2) == 0) {
        if (val->readfn == (CPReadFn_conflict *)0x0) {
          pTVar9 = load_cpu_offset(pTVar2,(int)val->fieldoffset);
        }
        else {
          pTVar8 = tcg_temp_new_internal_aarch64(pTVar2,TCG_TYPE_I32,false);
          pTVar9 = (TCGv_i32)((long)pTVar8 - (long)pTVar2);
          pTVar11 = tcg_const_i64_aarch64(pTVar2,(int64_t)val);
          local_58 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
          local_50 = (TCGTemp *)(pTVar11 + (long)pTVar2);
          tcg_gen_callN_aarch64(pTVar2,helper_get_cp_reg_aarch64,pTVar8,2,&local_58);
          tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar11 + (long)pTVar2));
        }
      }
      else {
        pTVar9 = tcg_const_i32_aarch64(pTVar2,(int32_t)val->resetvalue);
      }
      if (reg == 0xf) {
        gen_set_cpsr(pTVar2,pTVar9,0xf0000000);
        goto LAB_00652bf7;
      }
    }
    store_reg(s,reg,pTVar9);
  }
LAB_00652c1d:
  if ((((s->base).tb)->cflags & 0x20000) == 0) {
    bVar6 = 0;
  }
  else {
    bVar6 = (byte)val->type >> 6;
  }
  if ((val_00 != 0) || ((val->type & 8) != 0)) goto LAB_00652d13;
  pTVar9 = tcg_const_i32_aarch64(pTVar2,s->current_el);
  if ((s->features & 0x200) == 0) {
    local_58 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
    if ((val->type & 0x10000) == 0) {
      pcVar15 = helper_rebuild_hflags_a32_aarch64;
      goto LAB_00652cc1;
    }
    pcVar15 = helper_rebuild_hflags_a32_newel_aarch64;
    iVar7 = 1;
  }
  else {
    local_58 = (TCGTemp *)(pTVar2->cpu_env + (long)pTVar2);
    pcVar15 = helper_rebuild_hflags_m32_aarch64;
LAB_00652cc1:
    local_50 = (TCGTemp *)(pTVar9 + (long)pTVar2);
    iVar7 = 2;
  }
  tcg_gen_callN_aarch64(pTVar2,pcVar15,(TCGTemp *)0x0,iVar7,&local_58);
  tcg_temp_free_internal_aarch64(pTVar2,(TCGTemp *)(pTVar9 + (long)pTVar2));
  bVar6 = 1;
LAB_00652d13:
  if ((bVar6 & 1) != 0) {
    gen_lookup_tb(s);
    return 0;
  }
  return 0;
}

Assistant:

static int disas_coproc_insn(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int cpnum, is64, crn, crm, opc1, opc2, isread, rt, rt2;
    const ARMCPRegInfo *ri;

    cpnum = (insn >> 8) & 0xf;

    /* First check for coprocessor space used for XScale/iwMMXt insns */
    if (arm_dc_feature(s, ARM_FEATURE_XSCALE) && (cpnum < 2)) {
        if (extract32(s->c15_cpar, cpnum, 1) == 0) {
            return 1;
        }
        if (arm_dc_feature(s, ARM_FEATURE_IWMMXT)) {
            return disas_iwmmxt_insn(s, insn);
        } else if (arm_dc_feature(s, ARM_FEATURE_XSCALE)) {
            return disas_dsp_insn(s, insn);
        }
        return 1;
    }

    /* Otherwise treat as a generic register access */
    is64 = (insn & (1 << 25)) == 0;
    if (!is64 && ((insn & (1 << 4)) == 0)) {
        /* cdp */
        return 1;
    }

    crm = insn & 0xf;
    if (is64) {
        crn = 0;
        opc1 = (insn >> 4) & 0xf;
        opc2 = 0;
        rt2 = (insn >> 16) & 0xf;
    } else {
        crn = (insn >> 16) & 0xf;
        opc1 = (insn >> 21) & 7;
        opc2 = (insn >> 5) & 7;
        rt2 = 0;
    }
    isread = (insn >> 20) & 1;
    rt = (insn >> 12) & 0xf;

    ri = get_arm_cp_reginfo(s->cp_regs,
            ENCODE_CP_REG(cpnum, is64, s->ns, crn, crm, opc1, opc2));
    if (ri) {
        bool need_exit_tb;

        /* Check access permissions */
        if (!cp_access_ok(s->current_el, ri, isread)) {
            return 1;
        }

        if (s->hstr_active || ri->accessfn ||
            (arm_dc_feature(s, ARM_FEATURE_XSCALE) && cpnum < 14)) {
            /* Emit code to perform further access permissions checks at
             * runtime; this may result in an exception.
             * Note that on XScale all cp0..c13 registers do an access check
             * call in order to handle c15_cpar.
             */
            TCGv_ptr tmpptr;
            TCGv_i32 tcg_syn, tcg_isread;
            uint32_t syndrome;

            /* Note that since we are an implementation which takes an
             * exception on a trapped conditional instruction only if the
             * instruction passes its condition code check, we can take
             * advantage of the clause in the ARM ARM that allows us to set
             * the COND field in the instruction to 0xE in all cases.
             * We could fish the actual condition out of the insn (ARM)
             * or the condexec bits (Thumb) but it isn't necessary.
             */
            switch (cpnum) {
            case 14:
                if (is64) {
                    syndrome = syn_cp14_rrt_trap(1, 0xe, opc1, crm, rt, rt2,
                                                 isread, false);
                } else {
                    syndrome = syn_cp14_rt_trap(1, 0xe, opc1, opc2, crn, crm,
                                                rt, isread, false);
                }
                break;
            case 15:
                if (is64) {
                    syndrome = syn_cp15_rrt_trap(1, 0xe, opc1, crm, rt, rt2,
                                                 isread, false);
                } else {
                    syndrome = syn_cp15_rt_trap(1, 0xe, opc1, opc2, crn, crm,
                                                rt, isread, false);
                }
                break;
            default:
                /* ARMv8 defines that only coprocessors 14 and 15 exist,
                 * so this can only happen if this is an ARMv7 or earlier CPU,
                 * in which case the syndrome information won't actually be
                 * guest visible.
                 */
                assert(!arm_dc_feature(s, ARM_FEATURE_V8));
                syndrome = syn_uncategorized();
                break;
            }

            gen_set_condexec(s);
            gen_set_pc_im(s, s->pc_curr);
            tmpptr = tcg_const_ptr(tcg_ctx, ri);
            tcg_syn = tcg_const_i32(tcg_ctx, syndrome);
            tcg_isread = tcg_const_i32(tcg_ctx, isread);
            gen_helper_access_check_cp_reg(tcg_ctx, tcg_ctx->cpu_env, tmpptr, tcg_syn,
                                           tcg_isread);
            tcg_temp_free_ptr(tcg_ctx, tmpptr);
            tcg_temp_free_i32(tcg_ctx, tcg_syn);
            tcg_temp_free_i32(tcg_ctx, tcg_isread);
        } else if (ri->type & ARM_CP_RAISES_EXC) {
            /*
             * The readfn or writefn might raise an exception;
             * synchronize the CPU state in case it does.
             */
            gen_set_condexec(s);
            gen_set_pc_im(s, s->pc_curr);
        }

        /* Handle special cases first */
        switch (ri->type & ~(ARM_CP_FLAG_MASK & ~ARM_CP_SPECIAL)) {
        case ARM_CP_NOP:
            return 0;
        case ARM_CP_WFI:
            if (isread) {
                return 1;
            }
            gen_set_pc_im(s, s->base.pc_next);
            s->base.is_jmp = DISAS_WFI;
            return 0;
        default:
            break;
        }

        if ((tb_cflags(s->base.tb) & CF_USE_ICOUNT) && (ri->type & ARM_CP_IO)) {
            // gen_io_start(tcg_ctx);
        }

        if (isread) {
            /* Read */
            if (is64) {
                TCGv_i64 tmp64;
                TCGv_i32 tmp;
                if (ri->type & ARM_CP_CONST) {
                    tmp64 = tcg_const_i64(tcg_ctx, ri->resetvalue);
                } else if (ri->readfn) {
                    TCGv_ptr tmpptr;
                    tmp64 = tcg_temp_new_i64(tcg_ctx);
                    tmpptr = tcg_const_ptr(tcg_ctx, ri);
                    gen_helper_get_cp_reg64(tcg_ctx, tmp64, tcg_ctx->cpu_env, tmpptr);
                    tcg_temp_free_ptr(tcg_ctx, tmpptr);
                } else {
                    tmp64 = tcg_temp_new_i64(tcg_ctx);
                    tcg_gen_ld_i64(tcg_ctx, tmp64, tcg_ctx->cpu_env, ri->fieldoffset);
                }
                tmp = tcg_temp_new_i32(tcg_ctx);
                tcg_gen_extrl_i64_i32(tcg_ctx, tmp, tmp64);
                store_reg(s, rt, tmp);
                tmp = tcg_temp_new_i32(tcg_ctx);
                tcg_gen_extrh_i64_i32(tcg_ctx, tmp, tmp64);
                tcg_temp_free_i64(tcg_ctx, tmp64);
                store_reg(s, rt2, tmp);
            } else {
                TCGv_i32 tmp;
                if (ri->type & ARM_CP_CONST) {
                    tmp = tcg_const_i32(tcg_ctx, ri->resetvalue);
                } else if (ri->readfn) {
                    TCGv_ptr tmpptr;
                    tmp = tcg_temp_new_i32(tcg_ctx);
                    tmpptr = tcg_const_ptr(tcg_ctx, ri);
                    gen_helper_get_cp_reg(tcg_ctx, tmp, tcg_ctx->cpu_env, tmpptr);
                    tcg_temp_free_ptr(tcg_ctx, tmpptr);
                } else {
                    tmp = load_cpu_offset(tcg_ctx, ri->fieldoffset);
                }
                if (rt == 15) {
                    /* Destination register of r15 for 32 bit loads sets
                     * the condition codes from the high 4 bits of the value
                     */
                    gen_set_nzcv(tmp);
                    tcg_temp_free_i32(tcg_ctx, tmp);
                } else {
                    store_reg(s, rt, tmp);
                }
            }
        } else {
            /* Write */
            if (ri->type & ARM_CP_CONST) {
                /* If not forbidden by access permissions, treat as WI */
                return 0;
            }

            if (is64) {
                TCGv_i32 tmplo, tmphi;
                TCGv_i64 tmp64 = tcg_temp_new_i64(tcg_ctx);
                tmplo = load_reg(s, rt);
                tmphi = load_reg(s, rt2);
                tcg_gen_concat_i32_i64(tcg_ctx, tmp64, tmplo, tmphi);
                tcg_temp_free_i32(tcg_ctx, tmplo);
                tcg_temp_free_i32(tcg_ctx, tmphi);
                if (ri->writefn) {
                    TCGv_ptr tmpptr = tcg_const_ptr(tcg_ctx, ri);
                    gen_helper_set_cp_reg64(tcg_ctx, tcg_ctx->cpu_env, tmpptr, tmp64);
                    tcg_temp_free_ptr(tcg_ctx, tmpptr);
                } else {
                    tcg_gen_st_i64(tcg_ctx, tmp64, tcg_ctx->cpu_env, ri->fieldoffset);
                }
                tcg_temp_free_i64(tcg_ctx, tmp64);
            } else {
                if (ri->writefn) {
                    TCGv_i32 tmp;
                    TCGv_ptr tmpptr;
                    tmp = load_reg(s, rt);
                    tmpptr = tcg_const_ptr(tcg_ctx, ri);
                    gen_helper_set_cp_reg(tcg_ctx, tcg_ctx->cpu_env, tmpptr, tmp);
                    tcg_temp_free_ptr(tcg_ctx, tmpptr);
                    tcg_temp_free_i32(tcg_ctx, tmp);
                } else {
                    TCGv_i32 tmp = load_reg(s, rt);
                    store_cpu_offset(tcg_ctx, tmp, ri->fieldoffset);
                }
            }
        }

        /* I/O operations must end the TB here (whether read or write) */
        need_exit_tb = ((tb_cflags(s->base.tb) & CF_USE_ICOUNT) &&
                        (ri->type & ARM_CP_IO));

        if (!isread && !(ri->type & ARM_CP_SUPPRESS_TB_END)) {
            /*
             * A write to any coprocessor register that ends a TB
             * must rebuild the hflags for the next TB.
             */
            TCGv_i32 tcg_el = tcg_const_i32(tcg_ctx, s->current_el);
            if (arm_dc_feature(s, ARM_FEATURE_M)) {
                gen_helper_rebuild_hflags_m32(tcg_ctx, tcg_ctx->cpu_env, tcg_el);
            } else {
                if (ri->type & ARM_CP_NEWEL) {
                    gen_helper_rebuild_hflags_a32_newel(tcg_ctx, tcg_ctx->cpu_env);
                } else {
                    gen_helper_rebuild_hflags_a32(tcg_ctx, tcg_ctx->cpu_env, tcg_el);
                }
            }
            tcg_temp_free_i32(tcg_ctx, tcg_el);
            /*
             * We default to ending the TB on a coprocessor register write,
             * but allow this to be suppressed by the register definition
             * (usually only necessary to work around guest bugs).
             */
            need_exit_tb = true;
        }
        if (need_exit_tb) {
            gen_lookup_tb(s);
        }

        return 0;
    }

    /* Unknown register; this might be a guest error or a QEMU
     * unimplemented feature.
     */
    if (is64) {
        qemu_log_mask(LOG_UNIMP, "%s access to unsupported AArch32 "
                      "64 bit system register cp:%d opc1: %d crm:%d "
                      "(%s)\n",
                      isread ? "read" : "write", cpnum, opc1, crm,
                      s->ns ? "non-secure" : "secure");
    } else {
        qemu_log_mask(LOG_UNIMP, "%s access to unsupported AArch32 "
                      "system register cp:%d opc1:%d crn:%d crm:%d opc2:%d "
                      "(%s)\n",
                      isread ? "read" : "write", cpnum, opc1, crn, crm, opc2,
                      s->ns ? "non-secure" : "secure");
    }

    return 1;
}